

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

Gia_Obj_t * Gia_ManHashAndP(Gia_Man_t *p,Gia_Obj_t *p0,Gia_Obj_t *p1)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  pGVar4 = (Gia_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar4) && (pGVar4 < pGVar1 + p->nObjs)) {
    iVar3 = (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2);
    if (-1 < iVar3 * -0x55555555) {
      pGVar4 = (Gia_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
      if ((pGVar4 < pGVar1) || (pGVar1 + p->nObjs <= pGVar4)) goto LAB_0020b09f;
      iVar5 = (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2);
      if (-1 < iVar5 * -0x55555555) {
        uVar2 = Gia_ManHashAnd(p,((uint)p0 & 1) + iVar3 * 0x55555556,
                               ((uint)p1 & 1) + iVar5 * 0x55555556);
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if ((int)(uVar2 >> 1) < p->nObjs) {
          return (Gia_Obj_t *)((ulong)(uVar2 & 1) ^ (ulong)(p->pObjs + (uVar2 >> 1)));
        }
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_0020b09f:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline Gia_Obj_t * Gia_ManHashAndP( Gia_Man_t * p, Gia_Obj_t * p0, Gia_Obj_t * p1 )  
{ 
    return Gia_ObjFromLit( p, Gia_ManHashAnd( p, Gia_ObjToLit(p, p0), Gia_ObjToLit(p, p1) ) );
}